

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringconverter.cpp
# Opt level: O0

UConverter * QStringConverterICU::createConverterForName(char *name,State *state)

{
  bool bVar1;
  _func_void_void_ptr_UConverterToUnicodeArgs_ptr_char_ptr_int32_t_UConverterCallbackReason_UErrorCode_ptr
  *p_Var2;
  _func_void_void_ptr_UConverterFromUnicodeArgs_ptr_UChar_ptr_int32_t_UChar32_UConverterCallbackReason_UErrorCode_ptr
  *p_Var3;
  undefined8 in_RSI;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  UConverter *conv;
  anon_class_1_0_00000001 qmarkFromSubstituter;
  anon_class_1_0_00000001 qmarkToSubstituter;
  UErrorCode error_1;
  anon_class_1_0_00000001 nullFromSubstituter;
  anon_class_1_0_00000001 nullToSubstituter;
  UErrorCode error;
  UErrorCode status;
  undefined8 in_stack_ffffffffffffff98;
  QFlags<QStringConverterBase::Flag> *in_stack_ffffffffffffffa0;
  UConverter *pUVar4;
  UConverter *local_28;
  _lambda_void_const__UConverterFromUnicodeArgs__char16_t_const__int_int_UConverterCallbackReason_UErrorCode___2_
  local_1a;
  _lambda_void_const__UConverterToUnicodeArgs__char_const__int_UConverterCallbackReason_UErrorCode___2_
  local_19;
  undefined4 local_18;
  _lambda_void_const__UConverterFromUnicodeArgs__char16_t_const__int_int_UConverterCallbackReason_UErrorCode___1_
  local_12;
  _lambda_void_const__UConverterToUnicodeArgs__char_const__int_UConverterCallbackReason_UErrorCode___1_
  local_11;
  undefined4 local_10;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c = 0;
  local_28 = (UConverter *)ucnv_open_70(in_RDI,&local_c);
  if ((local_c == 0) || (local_c == -0x7a)) {
    bVar1 = QFlags<QStringConverterBase::Flag>::testFlag
                      (in_stack_ffffffffffffffa0,(Flag)((ulong)in_stack_ffffffffffffff98 >> 0x20));
    if (bVar1) {
      local_10 = 0;
      local_11 = (_lambda_void_const__UConverterToUnicodeArgs__char_const__int_UConverterCallbackReason_UErrorCode___1_
                  )0xaa;
      p_Var2 = createConverterForName(char_const*,QStringConverterBase::State_const*)::
               {lambda(void_const*,UConverterToUnicodeArgs*,char_const*,int,UConverterCallbackReason,UErrorCode*)#1}
               ::operator_cast_to_function_pointer(&local_11);
      ucnv_setToUCallBack_70(local_28,p_Var2,in_RSI,0,0,&local_10);
      local_12 = (_lambda_void_const__UConverterFromUnicodeArgs__char16_t_const__int_int_UConverterCallbackReason_UErrorCode___1_
                  )0xaa;
      p_Var3 = createConverterForName(char_const*,QStringConverterBase::State_const*)::
               {lambda(void_const*,UConverterFromUnicodeArgs*,char16_t_const*,int,int,UConverterCallbackReason,UErrorCode*)#1}
               ::operator_cast_to_function_pointer(&local_12);
      ucnv_setFromUCallBack_70(local_28,p_Var3,in_RSI,0,0,&local_10);
    }
    else {
      local_18 = 0;
      local_19 = (_lambda_void_const__UConverterToUnicodeArgs__char_const__int_UConverterCallbackReason_UErrorCode___2_
                  )0xaa;
      pUVar4 = local_28;
      p_Var2 = createConverterForName(char_const*,QStringConverterBase::State_const*)::
               {lambda(void_const*,UConverterToUnicodeArgs*,char_const*,int,UConverterCallbackReason,UErrorCode*)#2}
               ::operator_cast_to_function_pointer(&local_19);
      ucnv_setToUCallBack_70(pUVar4,p_Var2,in_RSI,0,0,&local_18);
      local_1a = (_lambda_void_const__UConverterFromUnicodeArgs__char16_t_const__int_int_UConverterCallbackReason_UErrorCode___2_
                  )0xaa;
      p_Var3 = createConverterForName(char_const*,QStringConverterBase::State_const*)::
               {lambda(void_const*,UConverterFromUnicodeArgs*,char16_t_const*,int,int,UConverterCallbackReason,UErrorCode*)#2}
               ::operator_cast_to_function_pointer(&local_1a);
      ucnv_setFromUCallBack_70(local_28,p_Var3,in_RSI,0,0,&local_18);
    }
  }
  else {
    ucnv_close_70(local_28);
    local_28 = (UConverter *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_28;
}

Assistant:

static UConverter *createConverterForName(const char *name, const State *state)
    {
        Q_ASSERT(name);
        Q_ASSERT(state);
        QT_COM_THREAD_INIT
        UErrorCode status = U_ZERO_ERROR;
        UConverter *conv = ucnv_open(name, &status);
        if (status != U_ZERO_ERROR && status != U_AMBIGUOUS_ALIAS_WARNING) {
            ucnv_close(conv);
            return nullptr;
        }

        if (state->flags.testFlag(Flag::ConvertInvalidToNull)) {
            UErrorCode error = U_ZERO_ERROR;

            auto nullToSubstituter = [](const void *context, UConverterToUnicodeArgs *toUArgs,
                                        const char *, int32_t length,
                                        UConverterCallbackReason reason, UErrorCode *err) {
                if (reason <= UCNV_IRREGULAR) {
                    *err = U_ZERO_ERROR;
                    UChar c = '\0';
                    ucnv_cbToUWriteUChars(toUArgs, &c, 1, 0, err);
                    // Recover outer scope's state (which isn't const) from context:
                    auto state = const_cast<State *>(static_cast<const State *>(context));
                    state->invalidChars += length;
                }
            };
            ucnv_setToUCallBack(conv, nullToSubstituter, state, nullptr, nullptr, &error);

            auto nullFromSubstituter = [](const void *context, UConverterFromUnicodeArgs *fromUArgs,
                                          const UChar *, int32_t length,
                                          UChar32, UConverterCallbackReason reason, UErrorCode *err) {
                if (reason <= UCNV_IRREGULAR) {
                    *err = U_ZERO_ERROR;
                    const UChar replacement[] = { 0 };
                    const UChar *stringBegin = std::begin(replacement);
                    ucnv_cbFromUWriteUChars(fromUArgs, &stringBegin, std::end(replacement), 0, err);
                    // Recover outer scope's state (which isn't const) from context:
                    auto state = const_cast<State *>(static_cast<const State *>(context));
                    state->invalidChars += length;
                }
            };
            ucnv_setFromUCallBack(conv, nullFromSubstituter, state, nullptr, nullptr, &error);
        } else {
            UErrorCode error = U_ZERO_ERROR;

            auto qmarkToSubstituter = [](const void *context, UConverterToUnicodeArgs *toUArgs,
                                         const char *codeUnits,int32_t length,
                                         UConverterCallbackReason reason, UErrorCode *err) {
                if (reason <= UCNV_IRREGULAR) {
                    // Recover outer scope's state (which isn't const) from context:
                    auto state = const_cast<State *>(static_cast<const State *>(context));
                    state->invalidChars += length;
                }
                // use existing ICU callback for logic
                UCNV_TO_U_CALLBACK_SUBSTITUTE(nullptr, toUArgs, codeUnits, length, reason, err);

            };
            ucnv_setToUCallBack(conv, qmarkToSubstituter, state, nullptr, nullptr, &error);

            auto qmarkFromSubstituter = [](const void *context, UConverterFromUnicodeArgs *fromUArgs,
                                           const UChar *codeUnits, int32_t length,
                                           UChar32 codePoint, UConverterCallbackReason reason, UErrorCode *err) {
                if (reason <= UCNV_IRREGULAR) {
                    // Recover outer scope's state (which isn't const) from context:
                    auto state = const_cast<State *>(static_cast<const State *>(context));
                    state->invalidChars += length;
                }
                // use existing ICU callback for logic
                UCNV_FROM_U_CALLBACK_SUBSTITUTE(nullptr, fromUArgs, codeUnits, length,
                                                codePoint, reason, err);
            };
            ucnv_setFromUCallBack(conv, qmarkFromSubstituter, state, nullptr, nullptr, &error);
        }
        return conv;
    }